

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_traits.cc
# Opt level: O3

void function_traits_on_lambda(void)

{
  int iVar1;
  UnitTest *pUVar2;
  undefined8 uVar3;
  long *local_30 [2];
  long local_20 [2];
  
  pUVar2 = UnitTest::getInstance();
  iVar1 = (*pUVar2->current_case_->_vptr_BaseCase[2])();
  if ((char)iVar1 == '\0') {
    pUVar2 = UnitTest::getInstance();
    local_30[0] = local_20;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
               ,"");
    std::__cxx11::string::_M_assign((string *)&pUVar2->last_checked_file_);
    if (local_30[0] != local_20) {
      operator_delete(local_30[0],local_20[0] + 1);
    }
    pUVar2 = UnitTest::getInstance();
    pUVar2->last_checked_line_ = 0x2b;
    pUVar2 = UnitTest::getInstance();
    iVar1 = (*pUVar2->current_case_->_vptr_BaseCase[2])();
    if ((char)iVar1 == '\0') {
      pUVar2 = UnitTest::getInstance();
      local_30[0] = local_20;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
                 ,"");
      std::__cxx11::string::_M_assign((string *)&pUVar2->last_checked_file_);
      if (local_30[0] != local_20) {
        operator_delete(local_30[0],local_20[0] + 1);
      }
      pUVar2 = UnitTest::getInstance();
      pUVar2->last_checked_line_ = 0x2c;
      pUVar2 = UnitTest::getInstance();
      iVar1 = (*pUVar2->current_case_->_vptr_BaseCase[2])();
      if ((char)iVar1 == '\0') {
        pUVar2 = UnitTest::getInstance();
        local_30[0] = local_20;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
                   ,"");
        std::__cxx11::string::_M_assign((string *)&pUVar2->last_checked_file_);
        if (local_30[0] != local_20) {
          operator_delete(local_30[0],local_20[0] + 1);
        }
        pUVar2 = UnitTest::getInstance();
        pUVar2->last_checked_line_ = 0x2d;
        pUVar2 = UnitTest::getInstance();
        iVar1 = (*pUVar2->current_case_->_vptr_BaseCase[2])();
        if ((char)iVar1 == '\0') {
          pUVar2 = UnitTest::getInstance();
          local_30[0] = local_20;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_30,
                     "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
                     ,"");
          std::__cxx11::string::_M_assign((string *)&pUVar2->last_checked_file_);
          if (local_30[0] != local_20) {
            operator_delete(local_30[0],local_20[0] + 1);
          }
          pUVar2 = UnitTest::getInstance();
          pUVar2->last_checked_line_ = 0x2e;
          pUVar2 = UnitTest::getInstance();
          iVar1 = (*pUVar2->current_case_->_vptr_BaseCase[2])();
          if ((char)iVar1 == '\0') {
            pUVar2 = UnitTest::getInstance();
            local_30[0] = local_20;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_30,
                       "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
                       ,"");
            std::__cxx11::string::_M_assign((string *)&pUVar2->last_checked_file_);
            if (local_30[0] != local_20) {
              operator_delete(local_30[0],local_20[0] + 1);
            }
            pUVar2 = UnitTest::getInstance();
            pUVar2->last_checked_line_ = 0x2f;
            pUVar2 = UnitTest::getInstance();
            iVar1 = (*pUVar2->current_case_->_vptr_BaseCase[2])();
            if ((char)iVar1 == '\0') {
              pUVar2 = UnitTest::getInstance();
              local_30[0] = local_20;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_30,
                         "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
                         ,"");
              std::__cxx11::string::_M_assign((string *)&pUVar2->last_checked_file_);
              if (local_30[0] != local_20) {
                operator_delete(local_30[0],local_20[0] + 1);
              }
              pUVar2 = UnitTest::getInstance();
              pUVar2->last_checked_line_ = 0x30;
              pUVar2 = UnitTest::getInstance();
              iVar1 = (*pUVar2->current_case_->_vptr_BaseCase[2])();
              if ((char)iVar1 == '\0') {
                pUVar2 = UnitTest::getInstance();
                local_30[0] = local_20;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_30,
                           "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
                           ,"");
                std::__cxx11::string::_M_assign((string *)&pUVar2->last_checked_file_);
                if (local_30[0] != local_20) {
                  operator_delete(local_30[0],local_20[0] + 1);
                }
                pUVar2 = UnitTest::getInstance();
                pUVar2->last_checked_line_ = 0x31;
                pUVar2 = UnitTest::getInstance();
                iVar1 = (*pUVar2->current_case_->_vptr_BaseCase[2])();
                if ((char)iVar1 == '\0') {
                  pUVar2 = UnitTest::getInstance();
                  local_30[0] = local_20;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_30,
                             "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
                             ,"");
                  std::__cxx11::string::_M_assign((string *)&pUVar2->last_checked_file_);
                  if (local_30[0] != local_20) {
                    operator_delete(local_30[0],local_20[0] + 1);
                  }
                  pUVar2 = UnitTest::getInstance();
                  pUVar2->last_checked_line_ = 0x32;
                  return;
                }
              }
            }
          }
        }
      }
    }
  }
  uVar3 = __cxa_allocate_exception(1);
  __cxa_throw(uVar3,&AbortThisCase::typeinfo,0);
}

Assistant:

TEST_CASE(function_traits_on_lambda)
{
    auto lambda = [](bool, char, int) { return 0; };
    TEST_CHECK(function_traits<decltype(lambda)>::arity == 3);
    TEST_CHECK(typeid(function_traits<decltype(lambda)>::function_type) == typeid(int(bool, char, int)));
    TEST_CHECK(typeid(function_traits<decltype(lambda)>::return_type) == typeid(int));
    TEST_CHECK(typeid(function_traits<decltype(lambda)>::stl_function_type) == typeid(std::function<int(bool, char, int)>));
    TEST_CHECK(typeid(function_traits<decltype(lambda)>::pointer) == typeid(int(*)(bool, char, int)));
    TEST_CHECK(typeid(function_traits<decltype(lambda)>::args<0>::type) == typeid(bool));
    TEST_CHECK(typeid(function_traits<decltype(lambda)>::args<1>::type) == typeid(char));
    TEST_CHECK(typeid(function_traits<decltype(lambda)>::args<2>::type) == typeid(int));
}